

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void __thiscall f8n::debug::FileBackend::warning(FileBackend *this,string *tag,string *string)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"warning",&local_41);
  writeTo((ostream *)&this->out,&local_40,tag,string);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void debug::FileBackend::warning(const std::string& tag, const std::string& string) {
        writeTo(this->out, "warning", tag, string);
    }